

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::draw_image
          (CImg<unsigned_int> *this,int x0,int y0,int z0,int c0,CImg<unsigned_int> *sprite,
          float opacity)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  float *pfVar8;
  int __x;
  CImg<unsigned_int> *pCVar9;
  float extraout_XMM0_Da;
  int local_160;
  int local_148;
  int local_130;
  int local_118;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_cc;
  uint *puStack_c8;
  int x;
  uint *ptrs;
  uint *ptrd;
  int y;
  int z;
  int c;
  float local_a4;
  float copacity;
  float nopacity;
  ulongT slx;
  int lc;
  int lz;
  int ly;
  int lx;
  int sc0;
  int sz0;
  int sy0;
  int sx0;
  int dc0;
  int dz0;
  int dy0;
  int dx0;
  bool bc;
  bool bz;
  bool by;
  bool bx;
  CImg<unsigned_int> local_58;
  float local_34;
  CImg<unsigned_int> *pCStack_30;
  float opacity_local;
  CImg<unsigned_int> *sprite_local;
  int c0_local;
  int z0_local;
  int y0_local;
  int x0_local;
  CImg<unsigned_int> *this_local;
  
  local_34 = opacity;
  pCStack_30 = sprite;
  sprite_local._0_4_ = c0;
  sprite_local._4_4_ = z0;
  c0_local = y0;
  z0_local = x0;
  _y0_local = this;
  bVar2 = is_empty(this);
  this_local = this;
  if ((!bVar2) &&
     (puVar7 = cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)pCStack_30),
     puVar7 != (uint *)0x0)) {
    bVar2 = is_overlapped<unsigned_int>(this,pCStack_30);
    iVar4 = z0_local;
    iVar3 = c0_local;
    iVar1 = sprite_local._4_4_;
    iVar6 = (int)sprite_local;
    if (bVar2) {
      operator+(&local_58,pCStack_30);
      this_local = draw_image(this,iVar4,iVar3,iVar1,iVar6,&local_58,local_34);
      ~CImg(&local_58);
    }
    else if (((((z0_local != 0) || (c0_local != 0)) || (sprite_local._4_4_ != 0)) ||
             (((int)sprite_local != 0 ||
              (bVar2 = is_sameXYZC<unsigned_int>(this,pCStack_30), !bVar2)))) ||
            ((local_34 < 1.0 || (bVar2 = is_shared(this), bVar2)))) {
      dy0._3_1_ = z0_local < 0;
      dy0._2_1_ = c0_local < 0;
      dy0._1_1_ = sprite_local._4_4_ < 0;
      dy0._0_1_ = (int)sprite_local < 0;
      if ((bool)dy0._3_1_) {
        local_fc = 0;
      }
      else {
        local_fc = z0_local;
      }
      dz0 = local_fc;
      if ((bool)dy0._2_1_) {
        local_100 = 0;
      }
      else {
        local_100 = c0_local;
      }
      dc0 = local_100;
      if ((bool)dy0._1_1_) {
        local_104 = 0;
      }
      else {
        local_104 = sprite_local._4_4_;
      }
      sx0 = local_104;
      if ((bool)(undefined1)dy0) {
        local_108 = 0;
      }
      else {
        local_108 = (int)sprite_local;
      }
      sy0 = local_108;
      sz0 = local_fc - z0_local;
      sc0 = local_100 - c0_local;
      lx = local_104 - sprite_local._4_4_;
      ly = local_108 - (int)sprite_local;
      iVar3 = width(pCStack_30);
      iVar6 = z0_local;
      iVar3 = iVar3 - sz0;
      iVar4 = width(pCStack_30);
      iVar5 = width(this);
      iVar1 = z0_local;
      if (iVar5 < iVar6 + iVar4) {
        iVar6 = width(pCStack_30);
        local_118 = width(this);
        local_118 = (iVar1 + iVar6) - local_118;
      }
      else {
        local_118 = 0;
      }
      lz = iVar3 - local_118;
      iVar3 = height(pCStack_30);
      iVar6 = c0_local;
      iVar3 = iVar3 - sc0;
      iVar4 = height(pCStack_30);
      iVar5 = height(this);
      iVar1 = c0_local;
      if (iVar5 < iVar6 + iVar4) {
        iVar6 = height(pCStack_30);
        local_130 = height(this);
        local_130 = (iVar1 + iVar6) - local_130;
      }
      else {
        local_130 = 0;
      }
      lc = iVar3 - local_130;
      iVar3 = depth(pCStack_30);
      iVar6 = sprite_local._4_4_;
      iVar3 = iVar3 - lx;
      iVar4 = depth(pCStack_30);
      iVar5 = depth(this);
      iVar1 = sprite_local._4_4_;
      if (iVar5 < iVar6 + iVar4) {
        iVar6 = depth(pCStack_30);
        local_148 = depth(this);
        local_148 = (iVar1 + iVar6) - local_148;
      }
      else {
        local_148 = 0;
      }
      slx._4_4_ = iVar3 - local_148;
      iVar3 = spectrum(pCStack_30);
      iVar6 = (int)sprite_local;
      iVar3 = iVar3 - ly;
      iVar4 = spectrum(pCStack_30);
      pCVar9 = this;
      iVar5 = spectrum(this);
      iVar1 = (int)sprite_local;
      __x = (int)pCVar9;
      if (iVar5 < iVar6 + iVar4) {
        iVar6 = spectrum(pCStack_30);
        pCVar9 = this;
        local_160 = spectrum(this);
        __x = (int)pCVar9;
        local_160 = (iVar1 + iVar6) - local_160;
      }
      else {
        local_160 = 0;
      }
      slx._0_4_ = iVar3 - local_160;
      _copacity = (long)lz << 2;
      cimg::abs(__x);
      z = 0;
      local_a4 = extraout_XMM0_Da;
      pfVar8 = std::max<float>(&local_34,(float *)&z);
      c = (int)(1.0 - *pfVar8);
      if (((0 < lz) && (0 < lc)) && ((0 < slx._4_4_ && (0 < (int)slx)))) {
        for (y = 0; y < (int)slx; y = y + 1) {
          for (ptrd._4_4_ = 0; ptrd._4_4_ < slx._4_4_; ptrd._4_4_ = ptrd._4_4_ + 1) {
            for (ptrd._0_4_ = 0; (int)ptrd < lc; ptrd._0_4_ = (int)ptrd + 1) {
              ptrs = data(this,dz0,dc0 + (int)ptrd,sx0 + ptrd._4_4_,sy0 + y);
              puStack_c8 = data(pCStack_30,sz0,sc0 + (int)ptrd,lx + ptrd._4_4_,ly + y);
              if (local_34 < 1.0) {
                for (local_cc = 0; local_cc < lz; local_cc = local_cc + 1) {
                  *ptrs = (uint)(long)(local_a4 * (float)*puStack_c8 + (float)*ptrs * (float)c);
                  ptrs = ptrs + 1;
                  puStack_c8 = puStack_c8 + 1;
                }
              }
              else {
                memcpy(ptrs,puStack_c8,_copacity);
              }
            }
          }
        }
      }
    }
    else {
      this_local = assign<unsigned_int>(this,pCStack_30,false);
    }
  }
  return this_local;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared())
        return assign(sprite,false);
      const bool bx = x0<0, by = y0<0, bz = z0<0, bc = c0<0;
      const int
        dx0 = bx?0:x0, dy0 = by?0:y0, dz0 = bz?0:z0, dc0 = bc?0:c0,
        sx0 = dx0 - x0,  sy0 = dy0 - y0, sz0 = dz0 - z0, sc0 = dc0 - c0,
        lx = sprite.width() - sx0 - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0),
        ly = sprite.height() - sy0 - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0),
        lz = sprite.depth() - sz0 - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0),
        lc = sprite.spectrum() - sc0 - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0);
      const ulongT slx = lx*sizeof(T);

      const float nopacity = cimg::abs(opacity), copacity = 1 - std::max(opacity,0.f);
      if (lx>0 && ly>0 && lz>0 && lc>0) {
        for (int c = 0; c<lc; ++c)
          for (int z = 0; z<lz; ++z)
            for (int y = 0; y<ly; ++y) {
              T *ptrd = data(dx0,dy0 + y,dz0 + z,dc0 + c);
              const T *ptrs = sprite.data(sx0,sy0 + y,sz0 + z,sc0 + c);
              if (opacity>=1) std::memcpy(ptrd,ptrs,slx);
              else for (int x = 0; x<lx; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
            }
      }
      return *this;
    }